

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O0

int rnndec_varmatch(rnndeccontext *ctx,rnnvarinfo *vi)

{
  long in_RSI;
  long in_RDI;
  int j;
  int i;
  int local_20;
  int local_1c;
  int local_4;
  
  if (*(int *)(in_RSI + 0x18) == 0) {
    for (local_1c = 0; local_1c < *(int *)(in_RSI + 0x38); local_1c = local_1c + 1) {
      local_20 = 0;
      while ((local_20 < *(int *)(in_RDI + 0x10) &&
             (**(long **)(*(long *)(in_RSI + 0x30) + (long)local_1c * 8) !=
              **(long **)(*(long *)(in_RDI + 8) + (long)local_20 * 8)))) {
        local_20 = local_20 + 1;
      }
      if (local_20 == *(int *)(in_RDI + 0x10)) {
        fprintf(_stderr,"I don\'t know which %s variant to use!\n",
                *(undefined8 *)**(undefined8 **)(*(long *)(in_RSI + 0x30) + (long)local_1c * 8));
      }
      else if (*(int *)(*(long *)(*(long *)(*(long *)(in_RSI + 0x30) + (long)local_1c * 8) + 8) +
                       (long)*(int *)(*(long *)(*(long *)(in_RDI + 8) + (long)local_20 * 8) + 8) * 4
                       ) == 0) {
        return 0;
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int rnndec_varmatch(struct rnndeccontext *ctx, struct rnnvarinfo *vi) {
	if (vi->dead)
		return 0;
	int i;
	for (i = 0; i < vi->varsetsnum; i++) {
		int j;
		for (j = 0; j < ctx->varsnum; j++)
			if (vi->varsets[i]->venum == ctx->vars[j]->en)
				break;
		if (j == ctx->varsnum) {
			fprintf (stderr, "I don't know which %s variant to use!\n", vi->varsets[i]->venum->name);
		} else {
			if (!vi->varsets[i]->variants[ctx->vars[j]->variant])
				return 0;
		}
	}
	return 1;
}